

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TracerouteRunner.cpp
# Opt level: O3

string * __thiscall
TracerouteRunner::get_output_line_abi_cxx11_(string *__return_storage_ptr__,TracerouteRunner *this)

{
  pointer pbVar1;
  _Alloc_hider _Var2;
  int iVar3;
  long *plVar4;
  char *pcVar5;
  ostream *poVar6;
  ulong uVar7;
  undefined1 auVar8 [12];
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mutex_results);
  if (iVar3 == 0) {
    uVar7 = (ulong)this->output_position;
    this->output_position = this->output_position + 1;
    pbVar1 = (this->results).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar7 < (ulong)((long)(this->results).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      _Var2._M_p = pbVar1[uVar7]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,_Var2._M_p,
                 _Var2._M_p + pbVar1[uVar7]._M_string_length);
      pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_results);
      return __return_storage_ptr__;
    }
  }
  else {
    std::__throw_system_error(iVar3);
  }
  auVar8 = std::__throw_out_of_range_fmt
                     ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  if (auVar8._8_4_ == 1) {
    plVar4 = (long *)__cxa_begin_catch(auVar8._0_8_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Out of Range Error: ",0x14);
    pcVar5 = (char *)(**(code **)(*plVar4 + 0x10))(plVar4);
    poVar6 = std::operator<<((ostream *)&std::cerr,pcVar5);
    std::endl<char,std::char_traits<char>>(poVar6);
    exit(1);
  }
  _Unwind_Resume(auVar8._0_8_);
}

Assistant:

std::string TracerouteRunner::get_output_line() {
	try {
		std::lock_guard<std::mutex> lock(this->mutex_results);
		return this->results.at(this->output_position++);
	} catch (const std::out_of_range& err) {
		std::cerr << "Out of Range Error: " << err.what() << std::endl;
		exit(1);
	}
}